

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subscription.h
# Opt level: O0

pair<aeron::ImageList_*,_int> __thiscall
aeron::Subscription::removeImage(Subscription *this,int64_t correlationId)

{
  undefined1 auVar1 [16];
  int64_t iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  ImageList *this_00;
  long in_RSI;
  undefined8 uVar6;
  long in_RDI;
  ulong uVar7;
  pair<aeron::ImageList_*,_int> pVar8;
  ImageList *newImageList;
  int j;
  int i_1;
  Image *newArray;
  int i;
  int index;
  int length;
  Image *oldArray;
  ImageList *oldImageList;
  Image *in_stack_ffffffffffffff38;
  Image *in_stack_ffffffffffffff40;
  Image *this_01;
  Image *local_98;
  ImageList *local_70;
  ImageList *local_68;
  int local_5c;
  int local_58;
  Image *local_48;
  int local_3c;
  int local_38;
  int local_34;
  Image *local_30;
  ImageList *local_28;
  long local_20;
  undefined1 local_10 [12];
  
  uVar6 = 2;
  local_20 = in_RSI;
  local_28 = std::atomic_load_explicit<aeron::ImageList*>
                       ((atomic<aeron::ImageList_*> *)(in_RDI + 0x50),memory_order_acquire);
  local_30 = local_28->m_images;
  local_34 = (int)local_28->m_length;
  local_38 = -1;
  local_3c = 0;
  do {
    if (local_34 <= local_3c) {
LAB_001dd063:
      if (local_38 != -1) {
        uVar3 = (ulong)(local_34 + -1);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar3;
        uVar4 = SUB168(auVar1 * ZEXT816(0x128),0);
        uVar7 = uVar4 + 8;
        if (SUB168(auVar1 * ZEXT816(0x128),8) != 0 || 0xfffffffffffffff7 < uVar4) {
          uVar7 = 0xffffffffffffffff;
        }
        puVar5 = (ulong *)operator_new__(uVar7);
        *puVar5 = uVar3;
        local_48 = (Image *)(puVar5 + 1);
        if (uVar3 != 0) {
          this_01 = local_48 + uVar3;
          local_98 = local_48;
          do {
            Image::Image(this_01);
            local_98 = local_98 + 1;
          } while (local_98 != this_01);
        }
        local_5c = 0;
        for (local_58 = 0; local_58 < local_34; local_58 = local_58 + 1) {
          if (local_58 != local_38) {
            local_5c = local_5c + 1;
            Image::operator=(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
          }
        }
        this_00 = (ImageList *)operator_new(0x10);
        ImageList::ImageList(this_00,local_48,(long)(local_34 + -1));
        local_68 = this_00;
        std::atomic_store_explicit<aeron::ImageList*>
                  ((atomic<aeron::ImageList_*> *)this_00,
                   (__atomic_val_t<aeron::ImageList_*>)in_stack_ffffffffffffff38,
                   memory_order_relaxed);
      }
      local_70 = local_28;
      if (local_38 == -1) {
        local_70 = (ImageList *)0x0;
      }
      std::pair<aeron::ImageList_*,_int>::pair<aeron::ImageList_*,_int_&,_true>
                ((pair<aeron::ImageList_*,_int> *)local_10,&local_70,&local_38);
      pVar8._12_4_ = 0;
      pVar8.first = (ImageList *)local_10._0_8_;
      pVar8.second = local_10._8_4_;
      return pVar8;
    }
    iVar2 = Image::correlationId(local_30 + local_3c);
    if (iVar2 == local_20) {
      Image::close(local_30 + local_3c,(int)uVar6);
      local_38 = local_3c;
      goto LAB_001dd063;
    }
    local_3c = local_3c + 1;
  } while( true );
}

Assistant:

std::pair<struct ImageList *, int> removeImage(std::int64_t correlationId)
    {
        struct ImageList *oldImageList = std::atomic_load_explicit(&m_imageList, std::memory_order_acquire);
        Image * oldArray = oldImageList->m_images;
        auto length = static_cast<int>(oldImageList->m_length);
        int index = -1;

        for (int i = 0; i < length; i++)
        {
            if (oldArray[i].correlationId() == correlationId)
            {
                oldArray[i].close();
                index = i;
                break;
            }
        }

        if (-1 != index)
        {
            auto newArray = new Image[length - 1];

            for (int i = 0, j = 0; i < length; i++)
            {
                if (i != index)
                {
                    newArray[j++] = oldArray[i];
                }
            }

            auto newImageList = new struct ImageList(newArray, length - 1);

            std::atomic_store_explicit(&m_imageList, newImageList, std::memory_order_release);
        }

        return std::pair<struct ImageList *, int>(
                (-1 != index) ? oldImageList : nullptr,
                index);
    }